

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::TableImport::~TableImport(TableImport *this)

{
  pointer pcVar1;
  
  (this->super_ImportMixin<(wabt::ExternalKind)1>).super_Import._vptr_Import =
       (_func_int **)&PTR__TableImport_001e0ac0;
  pcVar1 = (this->table).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->table).name.field_2) {
    operator_delete(pcVar1);
  }
  Import::~Import((Import *)this);
  operator_delete(this);
  return;
}

Assistant:

explicit TableImport(string_view name = string_view())
      : ImportMixin<ExternalKind::Table>(), table(name) {}